

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Sim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pAig;
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  char *pcVar7;
  Gia_ParSim_t Pars;
  char pFileNameOut [1000];
  Gia_ParSim_t local_444;
  char *local_428;
  Abc_Frame_t *local_420;
  char local_418 [1000];
  
  local_420 = pAbc;
  Gia_ManSimSetDefaultParams(&local_444);
  local_428 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00227b2c:
  iVar1 = Extra_UtilGetopt(argc,argv,"FWNTImvh");
  pAbc_00 = local_420;
  pcVar7 = local_428;
  iVar3 = globalUtilOptind;
  if (iVar1 < 0x57) {
    if (iVar1 < 0x4e) {
      if (iVar1 == 0x46) {
        if (globalUtilOptind < argc) {
          uVar2 = atoi(argv[globalUtilOptind]);
          local_444.nIters = uVar2;
          goto LAB_00227be0;
        }
        pcVar7 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00227ce0;
      }
      if (iVar1 == -1) {
        pAig = local_420->pGia;
        if (pAig != (Gia_Man_t *)0x0) {
          if (pAig->nRegs == 0) {
            Abc_Print(-1,"The network is combinational.\n");
            return 0;
          }
          if (local_428 != (char *)0x0) {
            __s = Extra_FileNameGeneric(local_428);
            sVar4 = strlen(__s);
            if (sVar4 < 900) {
              pcVar5 = Extra_FileNameExtension(pcVar7);
              sprintf(local_418,"%s_out.%s",__s,pcVar5);
              if (__s != (char *)0x0) {
                free(__s);
              }
              Gia_ManSimSimulatePattern(pAbc_00->pGia,pcVar7,local_418);
              return 1;
            }
            __assert_fail("strlen(pNameGeneric) < 900",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abc.c"
                          ,0x6f53,"int Abc_CommandAbc9Sim(Abc_Frame_t *, int, char **)");
          }
          local_420->nFrames = -1;
          iVar3 = Gia_ManSimSimulate(pAig,&local_444);
          pAbc_00->Status = -(uint)(iVar3 == 0);
          Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
          return 0;
        }
        pcVar7 = "Abc_CommandAbc9Sim(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_00227df4;
      }
      if (iVar1 != 0x49) goto LAB_00227cec;
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_00227ce0;
      }
      local_428 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      if (local_428 == (char *)0x0) {
LAB_00227cec:
        Abc_Print(-2,"usage: &sim [-FWNT num] [-mvh] -I <file>\n");
        Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
        Abc_Print(-2,"\t         (if candidate equivalences are defined, performs refinement)\n");
        Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                  (ulong)(uint)local_444.nIters);
        Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                  (ulong)(uint)local_444.nWords);
        Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                  (ulong)(uint)local_444.RandSeed);
        Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                  (ulong)(uint)local_444.TimeLimit);
        pcVar7 = "miter";
        if (local_444.fCheckMiter == 0) {
          pcVar7 = "circuit";
        }
        Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar7);
        pcVar7 = "yes";
        if (local_444.fVerbose == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        pcVar7 = 
        "\t-I file: (optional) file with input patterns (one line per frame, as many as PIs)\n";
        iVar3 = -2;
LAB_00227df4:
        Abc_Print(iVar3,pcVar7);
        return 1;
      }
      goto LAB_00227b2c;
    }
    if (iVar1 != 0x4e) {
      if (iVar1 != 0x54) goto LAB_00227cec;
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_00227ce0;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_444.TimeLimit = uVar2;
LAB_00227be0:
      globalUtilOptind = iVar3 + 1;
      if ((int)uVar2 < 0) goto LAB_00227cec;
      goto LAB_00227b2c;
    }
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_444.RandSeed = uVar2;
      goto LAB_00227be0;
    }
    pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
  }
  else {
    if (iVar1 != 0x57) {
      piVar6 = &local_444.fCheckMiter;
      if (iVar1 != 0x6d) {
        if (iVar1 != 0x76) goto LAB_00227cec;
        piVar6 = &local_444.fVerbose;
      }
      *(byte *)piVar6 = (byte)*piVar6 ^ 1;
      goto LAB_00227b2c;
    }
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_444.nWords = uVar2;
      goto LAB_00227be0;
    }
    pcVar7 = "Command line switch \"-W\" should be followed by an integer.\n";
  }
LAB_00227ce0:
  Abc_Print(-1,pcVar7);
  goto LAB_00227cec;
}

Assistant:

int Abc_CommandAbc9Sim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_ParSim_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    int c;
    Gia_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWNTImvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( pFileName == NULL )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pFileName != NULL )
    {
        extern void Gia_ManSimSimulatePattern( Gia_Man_t * p, char * pFileIn, char * pFileOut );
        char pFileNameOut[1000];
        char * pNameGeneric = Extra_FileNameGeneric(pFileName);
        assert( strlen(pNameGeneric) < 900 );
        sprintf( pFileNameOut, "%s_out.%s", pNameGeneric, Extra_FileNameExtension(pFileName) );
        ABC_FREE( pNameGeneric );
        Gia_ManSimSimulatePattern( pAbc->pGia, pFileName, pFileNameOut );
        return 1;
    }

    pAbc->nFrames = -1;
    if ( Gia_ManSimSimulate( pAbc->pGia, pPars ) )
        pAbc->Status =  0;
    else
        pAbc->Status = -1;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
//    if ( pLogFileName )
//        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&sim" );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim [-FWNT num] [-mvh] -I <file>\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t         (if candidate equivalences are defined, performs refinement)\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", pPars->nIters );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n", pPars->RandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-I file: (optional) file with input patterns (one line per frame, as many as PIs)\n");
    return 1;
}